

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_shque.c
# Opt level: O0

QcShmQue * qc_shqueue_attach(char *shm_name,char *que_name,QcErr *err)

{
  QcShm *qcShm_00;
  QcShmQue *qcShmQue;
  QcShm *qcShm;
  QcErr *err_local;
  char *que_name_local;
  char *shm_name_local;
  
  qcShm_00 = qc_shm_open(shm_name,err);
  if (qcShm_00 == (QcShm *)0x0) {
    shm_name_local = (char *)0x0;
  }
  else {
    shm_name_local = (char *)shm_queue_find(qcShm_00,que_name,err);
    if ((QcShmQue *)shm_name_local == (QcShmQue *)0x0) {
      qc_shm_close(qcShm_00);
      shm_name_local = (char *)0x0;
    }
  }
  return (QcShmQue *)shm_name_local;
}

Assistant:

QcShmQue* qc_shqueue_attach(const char *shm_name, const char *que_name, QcErr *err)
{
    QcShm* qcShm;
    QcShmQue* qcShmQue;

    qcShm = qc_shm_open(shm_name, err);
    if (NULL == qcShm)
    {
        return NULL;
    }

    qcShmQue = shm_queue_find(qcShm, que_name, err);
    if(NULL == qcShmQue)
    {
        qc_shm_close(qcShm);
        return NULL;
    }

    return qcShmQue;
}